

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O1

void Io_WriteAiger_old(Abc_Ntk_t *pNtk,char *pFileName,int fWriteSymbols,int fCompact)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  bool bVar6;
  uint uVar7;
  FILE *__stream;
  Abc_Obj_t *pAVar8;
  Vec_Int_t *vLits;
  Vec_Str_t *__ptr;
  void *pvVar9;
  ProgressBar *p;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  char *__format;
  size_t __size;
  int iVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  int local_40;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteAiger.c"
                  ,0x118,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
  }
  lVar12 = (long)pNtk->vBoxes->nSize;
  if (0 < lVar12) {
    lVar17 = 0;
    do {
      pvVar9 = pNtk->vBoxes->pArray[lVar17];
      if (((*(uint *)((long)pvVar9 + 0x14) & 0xf) == 8) && (*(long *)((long)pvVar9 + 0x38) != 1)) {
        if (fCompact != 0) {
          fwrite("Io_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n"
                 ,0x55,1,_stdout);
          return;
        }
        bVar21 = false;
        goto LAB_00337692;
      }
      lVar17 = lVar17 + 1;
    } while (lVar12 != lVar17);
  }
  bVar21 = pNtk->nConstrs == 0;
LAB_00337692:
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteAiger(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  pAVar8 = Abc_AigConst1(pNtk);
  (pAVar8->field_6).pTemp = (void *)0x0;
  pVVar10 = pNtk->vCis;
  if (pVVar10->nSize < 1) {
    uVar20 = 1;
  }
  else {
    uVar15 = 1;
    do {
      *(ulong *)((long)pVVar10->pArray[uVar15 - 1] + 0x40) = uVar15;
      uVar20 = uVar15 + 1;
      pVVar10 = pNtk->vCis;
      bVar6 = (long)uVar15 < (long)pVVar10->nSize;
      uVar15 = uVar20;
    } while (bVar6);
  }
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      puVar3 = (undefined8 *)pVVar10->pArray[lVar12];
      if (puVar3 != (undefined8 *)0x0) {
        if (((ulong)puVar3 & 1) != 0) goto LAB_00337de6;
        if (*(int *)*puVar3 != 3) goto LAB_00337ddd;
        if (*(int *)((long)puVar3 + 0x1c) == 2) {
          uVar15 = uVar20 & 0xffffffff;
          uVar20 = (ulong)((int)uVar20 + 1);
          puVar3[8] = uVar15;
        }
      }
      lVar12 = lVar12 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar12 < pVVar10->nSize);
  }
  pcVar13 = "2";
  if (fCompact == 0) {
    pcVar13 = "";
  }
  uVar11 = pNtk->vPis->nSize;
  uVar7 = pNtk->nObjCounts[8];
  uVar1 = pNtk->nObjCounts[7];
  uVar20 = (ulong)(uVar7 + uVar1 + uVar11);
  if (bVar21) {
    fprintf(__stream,"aig%s %u %u %u %u %u",pcVar13,uVar20,(ulong)uVar11,(ulong)uVar7,
            (ulong)(uint)pNtk->vPos->nSize,(ulong)uVar1);
  }
  else {
    fprintf(__stream,"aig%s %u %u %u %u %u",pcVar13,uVar20,(ulong)uVar11,(ulong)uVar7,0,(ulong)uVar1
           );
    fprintf(__stream," %u %u",(ulong)(uint)(pNtk->vPos->nSize - pNtk->nConstrs));
  }
  fputc(10,__stream);
  Abc_NtkInvertConstraints(pNtk);
  if (fCompact == 0) {
    pVVar10 = pNtk->vBoxes;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        plVar5 = (long *)pVVar10->pArray[lVar12];
        if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 8) {
          lVar17 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
          plVar4 = *(long **)(lVar17 + (long)*(int *)plVar5[4] * 8);
          iVar2 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                    (long)*(int *)plVar4[4] * 8) + 0x40);
          if (3 < (ulong)plVar5[7]) {
            __assert_fail("Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteAiger.c"
                          ,0x156,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
          }
          uVar20 = (ulong)(((uint)(iVar2 == 0) ^ *(uint *)((long)plVar4 + 0x14) >> 10 & 1) +
                          iVar2 * 2);
          switch(plVar5[7]) {
          default:
            fprintf(__stream,"%u %u\n",uVar20,
                    (ulong)(uint)(*(int *)(*(long *)(lVar17 + (long)*(int *)plVar5[6] * 8) + 0x40) *
                                 2));
            goto LAB_003379a6;
          case 1:
            pcVar13 = "%u\n";
            break;
          case 2:
            pcVar13 = "%u 1\n";
          }
          fprintf(__stream,pcVar13,uVar20);
        }
LAB_003379a6:
        lVar12 = lVar12 + 1;
        pVVar10 = pNtk->vBoxes;
      } while (lVar12 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vPos;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        plVar5 = (long *)pVVar10->pArray[lVar12];
        iVar2 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                  (long)*(int *)plVar5[4] * 8) + 0x40);
        fprintf(__stream,"%u\n",
                (ulong)(((uint)(iVar2 == 0) ^ *(uint *)((long)plVar5 + 0x14) >> 10 & 1) + iVar2 * 2)
               );
        lVar12 = lVar12 + 1;
        pVVar10 = pNtk->vPos;
      } while (lVar12 < pVVar10->nSize);
    }
  }
  else {
    vLits = Io_WriteAigerLiterals(pNtk);
    __ptr = Io_WriteEncodeLiterals(vLits);
    pcVar13 = __ptr->pArray;
    fwrite(pcVar13,1,(long)__ptr->nSize,__stream);
    if (pcVar13 != (char *)0x0) {
      free(pcVar13);
      __ptr->pArray = (char *)0x0;
    }
    if (__ptr != (Vec_Str_t *)0x0) {
      free(__ptr);
    }
    if (vLits->pArray != (int *)0x0) {
      free(vLits->pArray);
      vLits->pArray = (int *)0x0;
    }
    if (vLits != (Vec_Int_t *)0x0) {
      free(vLits);
    }
  }
  Abc_NtkInvertConstraints(pNtk);
  iVar2 = pNtk->nObjCounts[7];
  __size = (long)iVar2 * 6 + 100;
  pvVar9 = malloc(__size);
  p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
  pVVar10 = pNtk->vObjs;
  if (pVVar10->nSize < 1) {
    iVar19 = 0;
  }
  else {
    lVar12 = 0;
    iVar19 = 0;
    do {
      plVar5 = (long *)pVVar10->pArray[lVar12];
      if (plVar5 != (long *)0x0) {
        if (((ulong)plVar5 & 1) != 0) goto LAB_00337de6;
        if (*(int *)*plVar5 != 3) goto LAB_00337ddd;
        if (*(int *)((long)plVar5 + 0x1c) == 2) {
          if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar12)) {
            Extra_ProgressBarUpdate_int(p,(int)lVar12,(char *)0x0);
          }
          uVar16 = (int)plVar5[8] * 2;
          lVar17 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
          uVar11 = (*(uint *)((long)plVar5 + 0x14) >> 10 & 1) +
                   *(int *)(*(long *)(lVar17 + (long)*(int *)plVar5[4] * 8) + 0x40) * 2;
          uVar7 = (*(uint *)((long)plVar5 + 0x14) >> 0xb & 1) +
                  *(int *)(*(long *)(lVar17 + (long)((int *)plVar5[4])[1] * 8) + 0x40) * 2;
          uVar1 = uVar7;
          if (uVar11 < uVar7) {
            uVar1 = uVar11;
          }
          if (uVar7 < uVar11) {
            uVar7 = uVar11;
          }
          uVar11 = uVar16 - uVar7;
          if (uVar16 < uVar7 || uVar11 == 0) {
            __assert_fail("uLit1 < uLit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteAiger.c"
                          ,0x17c,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
          }
          if (0x7f < uVar11) {
            pbVar14 = (byte *)((long)iVar19 + (long)pvVar9);
            uVar16 = uVar11;
            do {
              *pbVar14 = (byte)uVar16 | 0x80;
              uVar11 = uVar16 >> 7;
              pbVar14 = pbVar14 + 1;
              iVar19 = iVar19 + 1;
              bVar6 = 0x3fff < uVar16;
              uVar16 = uVar11;
            } while (bVar6);
          }
          iVar18 = iVar19 + 1;
          *(char *)((long)pvVar9 + (long)iVar19) = (char)uVar11;
          uVar7 = uVar7 - uVar1;
          if (0x7f < uVar7) {
            pbVar14 = (byte *)((long)iVar18 + (long)pvVar9);
            uVar11 = uVar7;
            do {
              *pbVar14 = (byte)uVar11 | 0x80;
              uVar7 = uVar11 >> 7;
              pbVar14 = pbVar14 + 1;
              iVar18 = iVar18 + 1;
              bVar6 = 0x3fff < uVar11;
              uVar11 = uVar7;
            } while (bVar6);
          }
          *(char *)((long)pvVar9 + (long)iVar18) = (char)uVar7;
          if (iVar2 * 6 + 0x5a <= iVar18) {
            puts(
                "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small."
                );
            goto LAB_00337dac;
          }
          iVar19 = iVar18 + 1;
        }
      }
      lVar12 = lVar12 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar12 < pVVar10->nSize);
  }
  local_40 = (int)__size;
  if (local_40 <= iVar19) {
    __assert_fail("Pos < nBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteAiger.c"
                  ,0x186,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
  }
  Extra_ProgressBarStop(p);
  fwrite(pvVar9,1,(long)iVar19,__stream);
  if (pvVar9 != (void *)0x0) {
    free(pvVar9);
  }
  if (fWriteSymbols != 0) {
    pVVar10 = pNtk->vPis;
    if (0 < pVVar10->nSize) {
      uVar20 = 0;
      do {
        pcVar13 = Abc_ObjName((Abc_Obj_t *)pVVar10->pArray[uVar20]);
        fprintf(__stream,"i%d %s\n",uVar20 & 0xffffffff,pcVar13);
        uVar20 = uVar20 + 1;
        pVVar10 = pNtk->vPis;
      } while ((long)uVar20 < (long)pVVar10->nSize);
    }
    pVVar10 = pNtk->vBoxes;
    if (0 < pVVar10->nSize) {
      uVar20 = 0;
      do {
        plVar5 = (long *)pVVar10->pArray[uVar20];
        if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 8) {
          pcVar13 = Abc_ObjName(*(Abc_Obj_t **)
                                 (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                 (long)*(int *)plVar5[6] * 8));
          fprintf(__stream,"l%d %s\n",uVar20 & 0xffffffff,pcVar13);
        }
        uVar20 = uVar20 + 1;
        pVVar10 = pNtk->vBoxes;
      } while ((long)uVar20 < (long)pVVar10->nSize);
    }
    pVVar10 = pNtk->vPos;
    uVar20 = (ulong)(uint)pVVar10->nSize;
    if (0 < pVVar10->nSize) {
      uVar15 = 0;
      do {
        pAVar8 = (Abc_Obj_t *)pVVar10->pArray[uVar15];
        if (bVar21) {
          pcVar13 = Abc_ObjName(pAVar8);
          __format = "o%d %s\n";
LAB_00337d0f:
          uVar20 = uVar15 & 0xffffffff;
        }
        else {
          iVar2 = pNtk->nConstrs;
          if ((long)uVar15 < (long)((int)uVar20 - iVar2)) {
            pcVar13 = Abc_ObjName(pAVar8);
            __format = "b%d %s\n";
            goto LAB_00337d0f;
          }
          pcVar13 = Abc_ObjName(pAVar8);
          __format = "c%d %s\n";
          uVar20 = (ulong)(uint)((iVar2 - (int)uVar20) + (int)uVar15);
        }
        fprintf(__stream,__format,uVar20,pcVar13);
        uVar15 = uVar15 + 1;
        pVVar10 = pNtk->vPos;
        uVar20 = (ulong)pVVar10->nSize;
      } while ((long)uVar15 < (long)uVar20);
    }
  }
  fwrite("c\n",2,1,__stream);
  if ((pNtk->pName != (char *)0x0) && (*pNtk->pName != '\0')) {
    fprintf(__stream,".model %s\n");
  }
  pcVar13 = Extra_TimeStamp();
  fprintf(__stream,"This file was produced by ABC on %s\n",pcVar13);
  fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
LAB_00337dac:
  fclose(__stream);
  return;
LAB_00337de6:
  pcVar13 = "!Abc_ObjIsComplement(pNode)";
  goto LAB_00337ded;
LAB_00337ddd:
  pcVar13 = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_00337ded:
  __assert_fail(pcVar13,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

void Io_WriteAiger_old( Abc_Ntk_t * pNtk, char * pFileName, int fWriteSymbols, int fCompact )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Abc_Obj_t * pObj, * pDriver, * pLatch;
    int i, nNodes, nBufferSize, Pos, fExtended;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    fExtended = Abc_NtkConstrNum(pNtk);

    assert( Abc_NtkIsStrash(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( !Abc_LatchIsInit0(pObj) )
        {
            if ( !fCompact )
            {
                fExtended = 1;
                break;
            }
            fprintf( stdout, "Io_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n" );
            return;
        }

    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteAiger(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // set the node numbers to be used in the output file
    nNodes = 0;
    Io_ObjSetAigerNum( Abc_AigConst1(pNtk), nNodes++ );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );
    Abc_AigForEachAnd( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) + Abc_NtkNodeNum(pNtk), 
        Abc_NtkPiNum(pNtk),
        Abc_NtkLatchNum(pNtk),
        fExtended ? 0 : Abc_NtkPoNum(pNtk),
        Abc_NtkNodeNum(pNtk) );
    // write the extended header "B C J F"
    if ( fExtended )
        fprintf( pFile, " %u %u", Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk), Abc_NtkConstrNum(pNtk) );
    fprintf( pFile, "\n" );

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    Abc_NtkInvertConstraints( pNtk );
    if ( !fCompact ) 
    {
        // write latch drivers
        Abc_NtkForEachLatch( pNtk, pLatch, i )
        {
            pObj = Abc_ObjFanin0(pLatch);
            pDriver = Abc_ObjFanin0(pObj);
            uLit = Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) );
            if ( Abc_LatchIsInit0(pLatch) )
                fprintf( pFile, "%u\n", uLit );
            else if ( Abc_LatchIsInit1(pLatch) )
                fprintf( pFile, "%u 1\n", uLit );
            else
            {
                // Both None and DC are written as 'uninitialized' e.g. a free boolean value
                assert( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) );
                fprintf( pFile, "%u %u\n", uLit, Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanout0(pLatch)), 0 ) );
            }
        }
        // write PO drivers
        Abc_NtkForEachPo( pNtk, pObj, i )
        {
            pDriver = Abc_ObjFanin0(pObj);
            fprintf( pFile, "%u\n", Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
        }
    }
    else
    {
        Vec_Int_t * vLits = Io_WriteAigerLiterals( pNtk );
        Vec_Str_t * vBinary = Io_WriteEncodeLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Abc_NtkInvertConstraints( pNtk );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Abc_NtkNodeNum(pNtk) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit  = Io_ObjMakeLit( Io_ObjAigerNum(pObj), 0 );
        uLit0 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin0(pObj)), Abc_ObjFaninC0(pObj) );
        uLit1 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin1(pObj)), Abc_ObjFaninC1(pObj) );
        if ( uLit0 > uLit1 )
        {
            unsigned Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        assert( uLit1 < uLit );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, (unsigned)(uLit  - uLit1) );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, (unsigned)(uLit1 - uLit0) );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
            fclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
    Extra_ProgressBarStop( pProgress );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( fWriteSymbols )
    {
        // write PIs
        Abc_NtkForEachPi( pNtk, pObj, i )
            fprintf( pFile, "i%d %s\n", i, Abc_ObjName(pObj) );
        // write latches
        Abc_NtkForEachLatch( pNtk, pObj, i )
            fprintf( pFile, "l%d %s\n", i, Abc_ObjName(Abc_ObjFanout0(pObj)) );
        // write POs
        Abc_NtkForEachPo( pNtk, pObj, i )
            if ( !fExtended )
                fprintf( pFile, "o%d %s\n", i, Abc_ObjName(pObj) );
            else if ( i < Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
                fprintf( pFile, "b%d %s\n", i, Abc_ObjName(pObj) );
            else
                fprintf( pFile, "c%d %s\n", i - (Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk)), Abc_ObjName(pObj) );
    }

    // write the comment
    fprintf( pFile, "c\n" );
    if ( pNtk->pName && strlen(pNtk->pName) > 0 )
        fprintf( pFile, ".model %s\n", pNtk->pName );
    fprintf( pFile, "This file was produced by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
    fclose( pFile );
}